

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soul_heart_Optimisations.h
# Opt level: O1

int __thiscall
soul::Optimisations::Inliner::clone
          (Inliner *this,__fn *__fn,void *__child_stack,int __flags,void *__arg,...)

{
  Module *pMVar1;
  long lVar2;
  long lVar3;
  size_t sVar4;
  FunctionCall *pFVar5;
  Expression *pEVar6;
  long lVar7;
  pool_ptr<soul::heart::Expression> local_38;
  
  pMVar1 = this->module;
  if (*(Expression **)(__fn + 0x20) == (Expression *)0x0) {
    local_38.object = (Expression *)0x0;
  }
  else {
    local_38.object = cloneExpression(this,*(Expression **)(__fn + 0x20));
  }
  if (*(Function **)(__fn + 0x28) != (Function *)0x0) {
    pFVar5 = PoolAllocator::
             allocate<soul::heart::FunctionCall,soul::CodeLocation_const&,soul::pool_ptr<soul::heart::Expression>,soul::heart::Function&>
                       (&pMVar1->allocator->pool,(CodeLocation *)(__fn + 8),&local_38,
                        *(Function **)(__fn + 0x28));
    lVar2 = *(long *)(__fn + 0x38);
    if (lVar2 != 0) {
      lVar3 = *(long *)(__fn + 0x30);
      lVar7 = 0;
      do {
        pEVar6 = cloneExpression(this,*(Expression **)(lVar3 + lVar7));
        ArrayWithPreallocation<soul::pool_ref<soul::heart::Expression>,_4UL>::reserve
                  (&pFVar5->arguments,(pFVar5->arguments).numActive + 1);
        sVar4 = (pFVar5->arguments).numActive;
        (pFVar5->arguments).items[sVar4].object = pEVar6;
        (pFVar5->arguments).numActive = sVar4 + 1;
        lVar7 = lVar7 + 8;
      } while (lVar2 << 3 != lVar7);
    }
    return (int)pFVar5;
  }
  throwInternalCompilerError("object != nullptr","operator*",0x3b);
}

Assistant:

heart::FunctionCall& clone (const heart::FunctionCall& old)
        {
            auto& fc = module.allocate<heart::FunctionCall> (old.location, cloneExpressionPtr (old.target), old.getFunction());

            for (auto& arg : old.arguments)
                fc.arguments.push_back (cloneExpression (arg));

            return fc;
        }